

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::FieldMaskUtil::IsPathInFieldMask
          (FieldMaskUtil *this,StringPiece path,FieldMask *mask)

{
  FieldMaskUtil *__s2;
  char *size;
  pointer pcVar1;
  StringPiece x;
  char *__n;
  int iVar2;
  Type *pTVar3;
  undefined1 __s1 [8];
  int index;
  stringpiece_ssize_type len;
  StringPiece local_88;
  RepeatedPtrFieldBase *local_78;
  long local_70;
  FieldMaskUtil *local_68;
  char *local_60;
  size_t local_58;
  char local_50 [16];
  undefined1 local_40 [8];
  StringPiece path_local;
  
  local_70 = path.length_;
  path_local.ptr_ = path.ptr_;
  index = 0;
  if (0 < *(int *)(local_70 + 0x18)) {
    local_78 = (RepeatedPtrFieldBase *)(local_70 + 0x10);
    local_40 = (undefined1  [8])this;
    do {
      pTVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (local_78,index);
      __n = path_local.ptr_;
      __s2 = (FieldMaskUtil *)(pTVar3->_M_dataplus)._M_p;
      size = (char *)pTVar3->_M_string_length;
      __s1 = local_40;
      if ((long)size < 0) {
        local_68 = (FieldMaskUtil *)local_40;
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        __s1 = (undefined1  [8])local_68;
      }
      if (__n == size) {
        if ((long)__n < 1) {
          return true;
        }
        if (__s1 == (undefined1  [8])__s2) {
          return true;
        }
        iVar2 = bcmp((void *)__s1,__s2,(size_t)__n);
        if (iVar2 == 0) {
          return true;
        }
      }
      if ((char *)pTVar3->_M_string_length < path_local.ptr_) {
        local_88 = StringPiece::substr((StringPiece *)local_40,0,
                                       (size_type)((char *)pTVar3->_M_string_length + 1));
        local_60 = local_50;
        pcVar1 = (pTVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar1,pcVar1 + pTVar3->_M_string_length);
        std::__cxx11::string::append((char *)&local_60);
        x.length_ = local_58;
        x.ptr_ = local_60;
        if ((long)local_58 < 0) {
          StringPiece::LogFatalSizeTooBig(local_58,"size_t to int conversion");
        }
        iVar2 = StringPiece::compare(&local_88,x);
        if (local_60 != local_50) {
          operator_delete(local_60);
        }
        if (iVar2 == 0) {
          return true;
        }
      }
      index = index + 1;
    } while (index < *(int *)(local_70 + 0x18));
  }
  return false;
}

Assistant:

bool FieldMaskUtil::IsPathInFieldMask(StringPiece path,
                                      const FieldMask& mask) {
  for (int i = 0; i < mask.paths_size(); ++i) {
    const std::string& mask_path = mask.paths(i);
    if (path == mask_path) {
      return true;
    } else if (mask_path.length() < path.length()) {
      // Also check whether mask.paths(i) is a prefix of path.
      if (path.substr(0, mask_path.length() + 1).compare(mask_path + ".") ==
          0) {
        return true;
      }
    }
  }
  return false;
}